

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZconstraintForceModifier.cpp
# Opt level: O0

bool __thiscall OpenMD::ZConstraintForceModifier::haveFixedZMols(ZConstraintForceModifier *this)

{
  bool bVar1;
  long in_RDI;
  int haveFixed;
  
  bVar1 = std::__cxx11::list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_>::empty
                    ((list<OpenMD::ZconstraintMol,_std::allocator<OpenMD::ZconstraintMol>_> *)
                     (in_RDI + 0x28));
  return !bVar1;
}

Assistant:

bool ZConstraintForceModifier::haveFixedZMols() {
    int haveFixed = fixedZMols_.empty() ? 0 : 1;

#ifdef IS_MPI
    MPI_Allreduce(MPI_IN_PLACE, &haveFixed, 1, MPI_INT, MPI_SUM,
                  MPI_COMM_WORLD);
#endif

    return haveFixed > 0;
  }